

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O0

void __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::_logBlock
          (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *this,RABlock *block,uint32_t indentation
          )

{
  String *pSVar1;
  uint in_EDX;
  long in_RSI;
  String *in_RDI;
  ulong local_b8;
  size_t in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  uint local_80;
  uint local_7c;
  long local_78;
  long local_68;
  ulong local_60;
  undefined1 local_51;
  String *local_50;
  String *local_48;
  long *local_40;
  String *local_38;
  String *local_30;
  String *local_28;
  String *local_20;
  uint *local_18;
  char *local_10;
  String *local_8;
  
  local_7c = in_EDX;
  local_78 = in_RSI;
  String::clear(in_RDI + 0x68);
  local_50 = in_RDI + 0x68;
  local_60 = (ulong)local_7c;
  local_51 = 0x20;
  String::_opChars(in_RDI,(ModifyOp)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                   (char)((ulong)in_stack_ffffffffffffff60 >> 0x18),in_stack_ffffffffffffff58);
  local_8 = in_RDI + 0x68;
  local_68 = local_78;
  local_80 = *(uint *)(local_78 + 8);
  local_10 = "{#%u}\n";
  local_18 = &local_80;
  String::_opFormat(local_8,kAppend,"{#%u}\n",(ulong)local_80);
  local_40 = *(long **)(in_RDI + 0x50);
  local_48 = in_RDI + 0x68;
  if ((byte)*local_48 < 0x1f) {
    pSVar1 = in_RDI + 0x69;
  }
  else {
    pSVar1 = *(String **)(in_RDI + 0x80);
  }
  if ((byte)*local_48 < 0x1f) {
    local_b8 = (ulong)(byte)*local_48;
  }
  else {
    local_b8 = *(ulong *)(in_RDI + 0x70);
  }
  local_38 = local_48;
  local_30 = local_48;
  local_28 = local_48;
  local_20 = local_48;
  (**(code **)(*local_40 + 0x10))(local_40,pSVar1,local_b8);
  *(long *)(in_RDI + 0x48) = local_78;
  return;
}

Assistant:

void _logBlock(RABlock* block, uint32_t indentation) noexcept {
    _sb.clear();
    _sb.appendChars(' ', indentation);
    _sb.appendFormat("{#%u}\n", block->blockId());
    _logger->log(_sb);
    _lastLoggedBlock = block;
  }